

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_get_bucket
                    (ion_fpos_t bucket_loc,linear_hash_bucket_t *bucket,
                    linear_hash_table_t *linear_hash)

{
  int iVar1;
  size_t sVar2;
  ion_key_type_t local_48 [2];
  undefined8 local_40;
  ion_key_type_t *local_30;
  ion_byte_t *bucket_cache;
  linear_hash_table_t *linear_hash_local;
  linear_hash_bucket_t *bucket_local;
  ion_fpos_t bucket_loc_local;
  
  if (linear_hash->database == (FILE *)0x0) {
    bucket_loc_local._7_1_ = '\n';
  }
  else {
    local_40 = 0x112714;
    bucket_cache = (ion_byte_t *)linear_hash;
    linear_hash_local = (linear_hash_table_t *)bucket;
    bucket_local = (linear_hash_bucket_t *)bucket_loc;
    iVar1 = fseek((FILE *)linear_hash->database,bucket_loc,0);
    if (iVar1 == 0) {
      local_30 = local_48;
      sVar2 = fread(local_30,0x10,1,*(FILE **)(bucket_cache + 0x48));
      if (sVar2 == 1) {
        (linear_hash_local->super).key_type = *local_30;
        (linear_hash_local->super).record.key_size = local_30[1];
        *(undefined8 *)&(linear_hash_local->super).record.value_size = *(undefined8 *)(local_30 + 2)
        ;
        bucket_loc_local._7_1_ = '\0';
      }
      else {
        bucket_loc_local._7_1_ = '\b';
      }
    }
    else {
      bucket_loc_local._7_1_ = '\r';
    }
  }
  return bucket_loc_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_get_bucket(
	ion_fpos_t				bucket_loc,
	linear_hash_bucket_t	*bucket,
	linear_hash_table_t		*linear_hash
) {
	if (bucket_loc == -1) {}

	/* check if file is open */
	if (!linear_hash->database) {
		return err_file_close_error;
	}

	/* seek to location of record in file */
	if (0 != fseek(linear_hash->database, bucket_loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	ion_byte_t *bucket_cache = alloca(sizeof(linear_hash_bucket_t));

	if (1 != fread(bucket_cache, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_read_error;
	}

	/* read record data elements */
	memcpy(&bucket->idx, bucket_cache, sizeof(int));
	memcpy(&bucket->record_count, bucket_cache + sizeof(int), sizeof(int));
	memcpy(&bucket->overflow_location, bucket_cache + 2 * sizeof(int), sizeof(ion_fpos_t));

	return err_ok;
}